

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool mkvparser::Match(IMkvReader *pReader,longlong *pos,unsigned_long expected_id,longlong *val)

{
  int iVar1;
  unsigned_long uVar2;
  ulong size;
  longlong lVar3;
  long lVar4;
  longlong available;
  long len;
  longlong total;
  long local_38;
  long local_30;
  
  if ((pReader != (IMkvReader *)0x0) && (-1 < *pos)) {
    local_30 = 0;
    iVar1 = (*pReader->_vptr_IMkvReader[1])();
    if ((-1 < iVar1) && ((local_30 < 0 || (-1 < local_30)))) {
      local_38 = 0;
      uVar2 = ReadID(pReader,*pos,&local_38);
      if (-1 < (long)uVar2) {
        if (uVar2 != expected_id) {
          return false;
        }
        if (local_38 < -*pos) {
          return false;
        }
        lVar4 = local_38 + *pos;
        *pos = lVar4;
        size = ReadUInt(pReader,lVar4,&local_38);
        if ((0xfffffffffffffff7 < local_38 - 9U && size < 9) && (-*pos <= local_38)) {
          lVar4 = *pos + local_38;
          *pos = lVar4;
          lVar3 = UnserializeUInt(pReader,lVar4,size);
          *val = lVar3;
          if (-1 < lVar3) {
            *pos = *pos + size;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Match(IMkvReader* pReader, long long& pos, unsigned long expected_id,
           long long& val) {
  if (!pReader || pos < 0)
    return false;

  long long total = 0;
  long long available = 0;

  const long status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return false;

  long len = 0;

  const long long id = ReadID(pReader, pos, len);
  if (id < 0 || (available - pos) > len)
    return false;

  if (static_cast<unsigned long>(id) != expected_id)
    return false;

  pos += len;  // consume id

  const long long size = ReadUInt(pReader, pos, len);
  if (size < 0 || size > 8 || len < 1 || len > 8 || (available - pos) > len)
    return false;

  pos += len;  // consume length of size of payload

  val = UnserializeUInt(pReader, pos, size);
  if (val < 0)
    return false;

  pos += size;  // consume size of payload

  return true;
}